

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O0

OPJ_BYTE * opj_jp2_write_bpcc(opj_jp2_t *jp2,OPJ_UINT32 *p_nb_bytes_written)

{
  uint p_value;
  opj_procedure_list **local_38;
  OPJ_BYTE *l_current_bpcc_ptr;
  OPJ_BYTE *l_bpcc_data;
  OPJ_UINT32 l_bpcc_size;
  OPJ_UINT32 i;
  OPJ_UINT32 *p_nb_bytes_written_local;
  opj_jp2_t *jp2_local;
  
  if (jp2 == (opj_jp2_t *)0x0) {
    __assert_fail("jp2 != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/jp2.c"
                  ,0x2ba,"OPJ_BYTE *opj_jp2_write_bpcc(opj_jp2_t *, OPJ_UINT32 *)");
  }
  if (p_nb_bytes_written != (OPJ_UINT32 *)0x0) {
    p_value = jp2->numcomps + 8;
    jp2_local = (opj_jp2_t *)opj_calloc(1,(ulong)p_value);
    if (jp2_local == (opj_jp2_t *)0x0) {
      jp2_local = (opj_jp2_t *)0x0;
    }
    else {
      opj_write_bytes_LE((OPJ_BYTE *)jp2_local,p_value,4);
      opj_write_bytes_LE((OPJ_BYTE *)((long)&jp2_local->j2k + 4),0x62706363,4);
      local_38 = &jp2_local->m_validation_list;
      for (l_bpcc_data._4_4_ = 0; l_bpcc_data._4_4_ < jp2->numcomps;
          l_bpcc_data._4_4_ = l_bpcc_data._4_4_ + 1) {
        opj_write_bytes_LE((OPJ_BYTE *)local_38,jp2->comps[l_bpcc_data._4_4_].bpcc,1);
        local_38 = (opj_procedure_list **)((long)local_38 + 1);
      }
      *p_nb_bytes_written = p_value;
    }
    return (OPJ_BYTE *)jp2_local;
  }
  __assert_fail("p_nb_bytes_written != 00",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/jp2.c"
                ,699,"OPJ_BYTE *opj_jp2_write_bpcc(opj_jp2_t *, OPJ_UINT32 *)");
}

Assistant:

static OPJ_BYTE * opj_jp2_write_bpcc(opj_jp2_t *jp2,
                                     OPJ_UINT32 * p_nb_bytes_written
                                    )
{
    OPJ_UINT32 i;
    /* room for 8 bytes for box and 1 byte for each component */
    OPJ_UINT32 l_bpcc_size;
    OPJ_BYTE * l_bpcc_data, * l_current_bpcc_ptr;

    /* preconditions */
    assert(jp2 != 00);
    assert(p_nb_bytes_written != 00);
    l_bpcc_size = 8 + jp2->numcomps;

    l_bpcc_data = (OPJ_BYTE *) opj_calloc(1, l_bpcc_size);
    if (l_bpcc_data == 00) {
        return 00;
    }

    l_current_bpcc_ptr = l_bpcc_data;

    opj_write_bytes(l_current_bpcc_ptr, l_bpcc_size,
                    4);            /* write box size */
    l_current_bpcc_ptr += 4;

    opj_write_bytes(l_current_bpcc_ptr, JP2_BPCC, 4);               /* BPCC */
    l_current_bpcc_ptr += 4;

    for (i = 0; i < jp2->numcomps; ++i)  {
        opj_write_bytes(l_current_bpcc_ptr, jp2->comps[i].bpcc,
                        1); /* write each component information */
        ++l_current_bpcc_ptr;
    }

    *p_nb_bytes_written = l_bpcc_size;

    return l_bpcc_data;
}